

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void GenerateRandomFloat(float *data,size_t num)

{
  uint uVar1;
  size_t i;
  size_t sVar2;
  result_type_conflict rVar3;
  random_device rd;
  mt19937 e;
  param_type local_2748;
  random_device local_2738;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b0;
  
  std::random_device::random_device(&local_2738);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b0,(ulong)uVar1);
  local_2748 = (param_type)vmovhps_avx(ZEXT816(0) << 0x40,0x4024000000000000);
  for (sVar2 = 0; num != sVar2; sVar2 = sVar2 + 1) {
    rVar3 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)&local_2748,&local_13b0);
    data[sVar2] = (float)rVar3;
  }
  std::random_device::~random_device(&local_2738);
  return;
}

Assistant:

void GenerateRandomFloat(float *data, size_t num) {
  std::random_device rd;
  std::mt19937 e(rd());
  std::uniform_real_distribution<> dist(0, 10);

  for (size_t i = 0; i < num; i++) {
    data[i] = dist(e);
  }
}